

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

RegOpnd * __thiscall
Lowerer::GenerateForInEnumeratorLoad
          (Lowerer *this,Opnd *forInEnumeratorOpnd,Instr *insertBeforeInstr)

{
  int iVar1;
  Func *func_00;
  code *pcVar2;
  bool bVar3;
  int32 iVar4;
  SymOpnd *this_00;
  StackSym *pSVar5;
  undefined4 *puVar6;
  IndirOpnd *pIVar7;
  RegOpnd *pRVar8;
  RegOpnd *forInEnumeratorRegOpnd;
  uint forInLoopLevel;
  StackSym *stackSym;
  Func *func;
  Instr *insertBeforeInstr_local;
  Opnd *forInEnumeratorOpnd_local;
  Lowerer *this_local;
  
  func_00 = insertBeforeInstr->m_func;
  bVar3 = IR::Opnd::IsSymOpnd(forInEnumeratorOpnd);
  if (bVar3) {
    this_00 = IR::Opnd::AsSymOpnd(forInEnumeratorOpnd);
    pSVar5 = IR::Opnd::GetStackSym(&this_00->super_Opnd);
    if ((*(uint *)&pSVar5->field_0x18 >> 0xc & 1) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x7059,"(!stackSym->m_allocated)","!stackSym->m_allocated");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    iVar1 = pSVar5->m_offset;
    if (this->m_func->m_forInLoopMaxDepth <= func_00->m_forInLoopBaseDepth + iVar1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x705b,
                         "(func->m_forInLoopBaseDepth + forInLoopLevel < this->m_func->m_forInLoopMaxDepth)"
                         ,
                         "func->m_forInLoopBaseDepth + forInLoopLevel < this->m_func->m_forInLoopMaxDepth"
                        );
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    pSVar5->m_offset =
         this->m_func->m_forInEnumeratorArrayOffset + (func_00->m_forInLoopBaseDepth + iVar1) * 0x58
    ;
    *(uint *)&pSVar5->field_0x18 = *(uint *)&pSVar5->field_0x18 & 0xffffefff | 0x1000;
  }
  else {
    bVar3 = IR::Opnd::IsIndirOpnd(forInEnumeratorOpnd);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x7061,"(forInEnumeratorOpnd->IsIndirOpnd())",
                         "forInEnumeratorOpnd->IsIndirOpnd()");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    pIVar7 = IR::Opnd::AsIndirOpnd(forInEnumeratorOpnd);
    iVar4 = IR::IndirOpnd::GetOffset(pIVar7);
    if (iVar4 == 0) {
      pIVar7 = IR::Opnd::AsIndirOpnd(forInEnumeratorOpnd);
      pRVar8 = IR::IndirOpnd::GetBaseOpnd(pIVar7);
      return pRVar8;
    }
  }
  pRVar8 = IR::RegOpnd::New(TyUint64,func_00);
  InsertLea(pRVar8,forInEnumeratorOpnd,insertBeforeInstr);
  return pRVar8;
}

Assistant:

IR::RegOpnd *
Lowerer::GenerateForInEnumeratorLoad(IR::Opnd * forInEnumeratorOpnd, IR::Instr * insertBeforeInstr)
{
    Func * func = insertBeforeInstr->m_func;

    if (forInEnumeratorOpnd->IsSymOpnd())
    {
        StackSym * stackSym = forInEnumeratorOpnd->AsSymOpnd()->GetStackSym();
        Assert(!stackSym->m_allocated);
        uint forInLoopLevel = stackSym->m_offset;
        Assert(func->m_forInLoopBaseDepth + forInLoopLevel < this->m_func->m_forInLoopMaxDepth);
        stackSym->m_offset = this->m_func->m_forInEnumeratorArrayOffset + ((func->m_forInLoopBaseDepth + forInLoopLevel) * sizeof(Js::ForInObjectEnumerator));
        stackSym->m_allocated = true;
    }
    else
    {
        Assert(forInEnumeratorOpnd->IsIndirOpnd());
        if (forInEnumeratorOpnd->AsIndirOpnd()->GetOffset() == 0)
        {
            return forInEnumeratorOpnd->AsIndirOpnd()->GetBaseOpnd();
        }
    }
    IR::RegOpnd * forInEnumeratorRegOpnd = IR::RegOpnd::New(TyMachPtr, func);
    InsertLea(forInEnumeratorRegOpnd, forInEnumeratorOpnd, insertBeforeInstr);
    return forInEnumeratorRegOpnd;
}